

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

curl_slist * cookie_list(Curl_easy *data)

{
  char *data_00;
  curl_slist *pcVar1;
  uint local_3c;
  uint i;
  char *line;
  Cookie *c;
  curl_slist *beg;
  curl_slist *list;
  Curl_easy *data_local;
  
  beg = (curl_slist *)0x0;
  if ((data->cookies == (CookieInfo *)0x0) || (data->cookies->numcookies == 0)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    for (local_3c = 0; local_3c < 0x100; local_3c = local_3c + 1) {
      for (line = (char *)data->cookies->cookies[local_3c]; line != (char *)0x0;
          line = *(char **)line) {
        pcVar1 = beg;
        if (*(long *)(line + 0x28) != 0) {
          data_00 = get_netscape_format((Cookie *)line);
          if (data_00 == (char *)0x0) {
            curl_slist_free_all(beg);
            return (curl_slist *)0x0;
          }
          pcVar1 = Curl_slist_append_nodup(beg,data_00);
          if (pcVar1 == (curl_slist *)0x0) {
            (*Curl_cfree)(data_00);
            curl_slist_free_all(beg);
            return (curl_slist *)0x0;
          }
        }
        beg = pcVar1;
      }
    }
    data_local = (Curl_easy *)beg;
  }
  return (curl_slist *)data_local;
}

Assistant:

static struct curl_slist *cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
  struct curl_slist *beg;
  struct Cookie *c;
  char *line;
  unsigned int i;

  if((data->cookies == NULL) ||
      (data->cookies->numcookies == 0))
    return NULL;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    for(c = data->cookies->cookies[i]; c; c = c->next) {
      if(!c->domain)
        continue;
      line = get_netscape_format(c);
      if(!line) {
        curl_slist_free_all(list);
        return NULL;
      }
      beg = Curl_slist_append_nodup(list, line);
      if(!beg) {
        free(line);
        curl_slist_free_all(list);
        return NULL;
      }
      list = beg;
    }
  }

  return list;
}